

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O0

int32_t benchmark::Int32FromEnv(char *flag,int32_t default_value)

{
  bool bVar1;
  char *name;
  ostream *poVar2;
  char *in_RDX;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  int32_t local_5c [2];
  int32_t result;
  char *local_48;
  char *string_value;
  string env_var;
  int32_t default_value_local;
  char *flag_local;
  
  env_var.field_2._12_4_ = default_value;
  FlagToEnvVar_abi_cxx11_((string *)&string_value,(benchmark *)flag,in_RDX);
  name = (char *)std::__cxx11::string::c_str();
  local_48 = GetEnv(name);
  if (local_48 == (char *)0x0) {
    flag_local._4_4_ = env_var.field_2._12_4_;
  }
  else {
    local_5c[0] = env_var.field_2._12_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,"Environment variable ",&local_a1);
    std::operator+(&local_80,&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &string_value);
    bVar1 = ParseInt32(&local_80,local_48,local_5c);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      flag_local._4_4_ = local_5c[0];
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"The default value ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,env_var.field_2._12_4_);
      std::operator<<(poVar2," is used.\n");
      flag_local._4_4_ = env_var.field_2._12_4_;
    }
  }
  local_5c[1] = 1;
  std::__cxx11::string::~string((string *)&string_value);
  return flag_local._4_4_;
}

Assistant:

int32_t Int32FromEnv(const char* flag, int32_t default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = GetEnv(env_var.c_str());
  if (string_value == nullptr) {
    // The environment variable is not set.
    return default_value;
  }

  int32_t result = default_value;
  if (!ParseInt32(std::string("Environment variable ") + env_var, string_value,
                  &result)) {
    std::cout << "The default value " << default_value << " is used.\n";
    return default_value;
  }

  return result;
}